

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::StringTree> * __thiscall
kj::ArrayBuilder<kj::StringTree>::operator=
          (ArrayBuilder<kj::StringTree> *this,ArrayBuilder<kj::StringTree> *other)

{
  StringTree *pSVar1;
  RemoveConst<kj::StringTree> *pRVar2;
  StringTree *pSVar3;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (StringTree *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (StringTree *)0x0;
    this->pos = (RemoveConst<kj::StringTree> *)0x0;
    this->endPtr = (StringTree *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pSVar1,0x38,((long)pRVar2 - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7,
               ((long)pSVar3 - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7,
               ArrayDisposer::Dispose_<kj::StringTree>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (StringTree *)0x0;
  other->pos = (RemoveConst<kj::StringTree> *)0x0;
  other->endPtr = (StringTree *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }